

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int history_def_curr(void *p,HistEvent_conflict *ev)

{
  undefined8 *puVar1;
  char *pcVar2;
  uint uVar3;
  
  puVar1 = *(undefined8 **)((long)p + 0x28);
  if (puVar1 != (undefined8 *)p) {
    pcVar2 = (char *)puVar1[1];
    *(undefined8 *)ev = *puVar1;
    ev->str = pcVar2;
    return 0;
  }
  uVar3 = (uint)(0 < *(int *)((long)p + 0x34)) * 3 + 5;
  ev->num = uVar3;
  ev->str = he_errlist[uVar3];
  return -1;
}

Assistant:

static int
history_def_curr(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	if (h->cursor != &h->list)
		*ev = h->cursor->ev;
	else {
		he_seterrev(ev,
		    (h->cur > 0) ? _HE_CURR_INVALID : _HE_EMPTY_LIST);
		return -1;
	}

	return 0;
}